

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mzp_extract.cpp
# Opt level: O3

int main(int argc,char **argv)

{
  path *this;
  bool bVar1;
  char cVar2;
  int iVar3;
  uint uVar4;
  undefined4 in_register_0000003c;
  uint in_R8D;
  int iVar5;
  ulong uVar6;
  undefined1 local_108 [8];
  Mzp mzp;
  undefined1 local_c0 [8];
  string file_name;
  string archive_data;
  size_type *local_78;
  string path;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_48;
  
  mzp.entry_data.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)CONCAT44(in_register_0000003c,argc);
  if (argc - 4U < 0xfffffffe) {
    main_cold_4();
    return -1;
  }
  file_name.field_2._8_8_ = &archive_data._M_string_length;
  archive_data._M_dataplus._M_p = (pointer)0x0;
  archive_data._M_string_length._0_1_ = 0;
  bVar1 = mg::fs::read_file(argv[1],(string *)((long)&file_name.field_2 + 8));
  iVar3 = -1;
  if (!bVar1) goto LAB_001038e4;
  mzp.entry_data.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  mzp.entry_data.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  mzp.entry_headers.
  super__Vector_base<mg::data::Mzp::MzpArchiveEntry,_std::allocator<mg::data::Mzp::MzpArchiveEntry>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  mzp.entry_headers.
  super__Vector_base<mg::data::Mzp::MzpArchiveEntry,_std::allocator<mg::data::Mzp::MzpArchiveEntry>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  mzp.header.magic[0] = '\0';
  mzp.header.magic[1] = '\0';
  mzp.header.magic[2] = '\0';
  mzp.header.magic[3] = '\0';
  mzp.header.magic[4] = '\0';
  mzp.header.magic[5] = '\0';
  mzp.header.archive_entry_count = 0;
  mzp.entry_headers.
  super__Vector_base<mg::data::Mzp::MzpArchiveEntry,_std::allocator<mg::data::Mzp::MzpArchiveEntry>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  bVar1 = mg::data::mzp_read((string *)((long)&file_name.field_2 + 8),(Mzp *)local_108);
  if (bVar1) {
    archive_data.field_2._8_8_ = argv + 2;
    std::filesystem::__cxx11::path::path<char*,std::filesystem::__cxx11::path>
              ((path *)((long)&path.field_2 + 8),(char **)archive_data.field_2._8_8_,auto_format);
    cVar2 = std::filesystem::status((path *)((long)&path.field_2 + 8));
    std::filesystem::__cxx11::path::~path((path *)((long)&path.field_2 + 8));
    if ((cVar2 == '\0') || (cVar2 == -1)) {
      main_cold_2();
      goto LAB_001038b4;
    }
    if ((MzpArchiveHeader)
        mzp.entry_headers.
        super__Vector_base<mg::data::Mzp::MzpArchiveEntry,_std::allocator<mg::data::Mzp::MzpArchiveEntry>_>
        ._M_impl.super__Vector_impl_data._M_start == mzp.header) {
      iVar3 = 0;
    }
    else {
      uVar6 = 0;
      uVar4 = 1;
      this = (path *)(&path.field_2._M_allocated_capacity + 1);
      iVar5 = 0;
      do {
        local_48._M_allocated_capacity._0_7_ = 0x753430255f7325;
        local_48._7_4_ = 0x6e69622e;
        local_48._M_local_buf[0xb] = '\0';
        path.field_2._8_8_ = &local_48;
        mg::string::format<char*,unsigned_int>
                  ((string *)local_c0,(string *)this,(string *)argv[1],(char *)(ulong)(uVar4 - 1),
                   in_R8D);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)path.field_2._8_8_ != &local_48) {
          operator_delete((void *)path.field_2._8_8_,
                          CONCAT17(local_48._M_local_buf[7],local_48._M_allocated_capacity._0_7_) +
                          1);
        }
        if ((int)mzp.entry_data.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage == 3) {
          std::filesystem::__cxx11::path::path<char*,std::filesystem::__cxx11::path>
                    (this,(char **)archive_data.field_2._8_8_,auto_format);
          std::filesystem::__cxx11::path::_M_append(this,file_name._M_dataplus._M_p,local_c0);
          local_78 = &path._M_string_length;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_78,path.field_2._8_8_,path.field_2._8_8_ + 0xb);
        }
        else {
          std::filesystem::__cxx11::path::path<std::__cxx11::string,std::filesystem::__cxx11::path>
                    (this,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_c0,auto_format);
          local_78 = &path._M_string_length;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_78,path.field_2._8_8_,path.field_2._8_8_ + 0xb);
        }
        std::filesystem::__cxx11::path::~path(this);
        if (local_c0 != (undefined1  [8])&file_name._M_string_length) {
          operator_delete((void *)local_c0,file_name._M_string_length + 1);
        }
        bVar1 = mg::fs::write_file((char *)local_78,
                                   (string *)
                                   (mzp.entry_headers.
                                    super__Vector_base<mg::data::Mzp::MzpArchiveEntry,_std::allocator<mg::data::Mzp::MzpArchiveEntry>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage + uVar6 * 4))
        ;
        iVar3 = -1;
        if (bVar1) {
          main_cold_3();
          iVar3 = iVar5;
        }
        if (local_78 != &path._M_string_length) {
          operator_delete(local_78,path._M_string_length + 1);
        }
        if (!bVar1) goto LAB_001038ba;
        uVar6 = (ulong)uVar4;
        uVar4 = uVar4 + 1;
        iVar5 = iVar3;
      } while (uVar6 < (ulong)((long)mzp.entry_headers.
                                     super__Vector_base<mg::data::Mzp::MzpArchiveEntry,_std::allocator<mg::data::Mzp::MzpArchiveEntry>_>
                                     ._M_impl.super__Vector_impl_data._M_start - (long)mzp.header >>
                              3));
      iVar3 = 0;
    }
  }
  else {
    main_cold_1();
LAB_001038b4:
    iVar3 = -1;
  }
LAB_001038ba:
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&mzp.entry_headers.
                super__Vector_base<mg::data::Mzp::MzpArchiveEntry,_std::allocator<mg::data::Mzp::MzpArchiveEntry>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
  if (mzp.header != (MzpArchiveHeader)0x0) {
    operator_delete((void *)mzp.header,
                    (long)mzp.entry_headers.
                          super__Vector_base<mg::data::Mzp::MzpArchiveEntry,_std::allocator<mg::data::Mzp::MzpArchiveEntry>_>
                          ._M_impl.super__Vector_impl_data._M_finish - (long)mzp.header);
  }
LAB_001038e4:
  if ((size_type *)file_name.field_2._8_8_ != &archive_data._M_string_length) {
    operator_delete((void *)file_name.field_2._8_8_,
                    CONCAT71(archive_data._M_string_length._1_7_,
                             (undefined1)archive_data._M_string_length) + 1);
  }
  return iVar3;
}

Assistant:

int main(int argc, char **argv) {
  if (argc != 2 && argc != 3) {
    fprintf(stderr, "%s infile [out_dir]\n", argv[0]);
    return -1;
  }

  // Read input file
  std::string archive_data;
  if (!mg::fs::read_file(argv[1], archive_data)) {
    return -1;
  }

  // Extract header
  mg::data::Mzp mzp;
  if (!mg::data::mzp_read(archive_data, mzp)) {
    fprintf(stderr, "Failed to parse archive\n");
    return -1;
  }

  // If we are putting output in a specific folder, check it exists
  if (!std::filesystem::exists(argv[2])) {
    fprintf(stderr, "Output directory '%s' does not exist, exiting\n", argv[2]);
    return -1;
  }

  // Helper to get output file path for entries
  auto output_path = [&](unsigned entry) -> std::string {
    std::string file_name = mg::string::format("%s_%04u.bin", argv[1], entry);
    if (argc == 3) {
      return std::filesystem::path(argv[2]).append(file_name);
    } else {
      return std::filesystem::path(file_name);
    }
  };

  // Split MZP into constituent files
  for (unsigned i = 0; i < mzp.entry_headers.size(); i++) {
    std::string path = output_path(i);
    auto &data = mzp.entry_data[i];
    if (!mg::fs::write_file(path.c_str(), data)) {
      return -1;
    }
    fprintf(stderr, "Wrote %s\n", path.c_str());
  }

  return 0;
}